

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O0

void __thiscall CGameContext::SendVoteSet(CGameContext *this,int Type,int ToClientID)

{
  long lVar1;
  int64 iVar2;
  undefined4 in_EDX;
  undefined4 in_ESI;
  CGameContext *in_RDI;
  long in_FS_OFFSET;
  CNetMsg_Sv_VoteSet Msg;
  long in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->m_VoteCloseTime != 0) {
    in_stack_ffffffffffffffb8 = in_RDI->m_VoteCloseTime;
    iVar2 = time_get();
    in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 - iVar2;
    time_freq();
  }
  Server(in_RDI);
  IServer::SendPackMsg<CNetMsg_Sv_VoteSet>
            ((IServer *)CONCAT44(in_ESI,in_EDX),(CNetMsg_Sv_VoteSet *)in_RDI,
             (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameContext::SendVoteSet(int Type, int ToClientID)
{
	CNetMsg_Sv_VoteSet Msg;
	if(m_VoteCloseTime)
	{
		Msg.m_ClientID = m_VoteCreator;
		Msg.m_Type = Type;
		Msg.m_Timeout = (m_VoteCloseTime-time_get())/time_freq();
		Msg.m_pDescription = m_aVoteDescription;
		Msg.m_pReason = m_aVoteReason;
	}
	else
	{
		Msg.m_Type = Type;
		Msg.m_Timeout = 0;
		Msg.m_ClientID = m_VoteCreator;
		Msg.m_pDescription = "";
		Msg.m_pReason = "";
	}
	Server()->SendPackMsg(&Msg, MSGFLAG_VITAL, ToClientID);
}